

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::DefaultPerformanceTrackingCallback::handle
          (DefaultPerformanceTrackingCallback *this,PerformanceTrackingData *data)

{
  byte bVar1;
  bool bVar2;
  DataType DVar3;
  Level level;
  ostream *poVar4;
  char *pcVar5;
  string_t *psVar6;
  element_type *this_00;
  ulong uVar7;
  PerformanceTracker *pPVar8;
  unsigned_long line;
  char *func;
  Writer *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  Writer local_260;
  string local_1f0;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream_t ss;
  ostream local_190 [376];
  PerformanceTrackingData *local_18;
  PerformanceTrackingData *data_local;
  DefaultPerformanceTrackingCallback *this_local;
  
  this->m_data = data;
  local_18 = data;
  data_local = (PerformanceTrackingData *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  DVar3 = PerformanceTrackingData::dataType(this->m_data);
  if (DVar3 == Complete) {
    poVar4 = std::operator<<(local_190,"Executed [");
    PerformanceTrackingData::blockName_abi_cxx11_(this->m_data);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"] in [");
    psVar6 = PerformanceTrackingData::formattedTimeTaken_abi_cxx11_(this->m_data);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    std::operator<<(poVar4,"]");
  }
  else {
    std::operator<<(local_190,"Performance checkpoint");
    PerformanceTrackingData::checkpointId_abi_cxx11_(&local_1d0,this->m_data);
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_1d0);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      poVar4 = std::operator<<(local_190," [");
      PerformanceTrackingData::checkpointId_abi_cxx11_(&local_1f0,this->m_data);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::operator<<(poVar4,"]");
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    poVar4 = std::operator<<(local_190," for block [");
    PerformanceTrackingData::blockName_abi_cxx11_(this->m_data);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"] : [");
    pPVar8 = PerformanceTrackingData::performanceTracker(this->m_data);
    el::operator<<(poVar4,(Loggable *)(pPVar8 + 0x10));
    this_00 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)elStorage);
    bVar2 = Storage::hasFlag(this_00,DisablePerformanceTrackingCheckpointComparison);
    if ((bVar2) ||
       (pPVar8 = PerformanceTrackingData::performanceTracker(this->m_data),
       ((byte)pPVar8[100] & 1) == 0)) {
      std::operator<<(local_190,"]");
    }
    else {
      poVar4 = std::operator<<(local_190," ([");
      psVar6 = PerformanceTrackingData::formattedTimeTaken_abi_cxx11_(this->m_data);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      std::operator<<(poVar4,"] from ");
      PerformanceTrackingData::performanceTracker(this->m_data);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        poVar4 = std::operator<<(local_190,"checkpoint \'");
        PerformanceTrackingData::performanceTracker(this->m_data);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,"\'");
      }
      else {
        std::operator<<(local_190,"last checkpoint");
      }
      std::operator<<(local_190,")]");
    }
  }
  pPVar8 = PerformanceTrackingData::performanceTracker(this->m_data);
  level = PerformanceTracker::level(pPVar8);
  pcVar5 = PerformanceTrackingData::file(this->m_data);
  line = PerformanceTrackingData::line(this->m_data);
  func = PerformanceTrackingData::func(this->m_data);
  Writer::Writer(&local_260,level,pcVar5,line,func,NormalLog,0);
  PerformanceTrackingData::loggerId_abi_cxx11_(this->m_data);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  this_01 = Writer::construct(&local_260,1,pcVar5);
  std::__cxx11::stringstream::str();
  Writer::operator<<(this_01,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  Writer::~Writer(&local_260);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void handle(const PerformanceTrackingData* data) {
        m_data = data;
        base::type::stringstream_t ss;
        if (m_data->dataType() == PerformanceTrackingData::DataType::Complete) {
            ss << ELPP_LITERAL("Executed [") << m_data->blockName()->c_str() << ELPP_LITERAL("] in [") << *m_data->formattedTimeTaken() << ELPP_LITERAL("]");
        } else {
            ss << ELPP_LITERAL("Performance checkpoint");
            if (!m_data->checkpointId().empty()) {
                ss << ELPP_LITERAL(" [") << m_data->checkpointId().c_str() << ELPP_LITERAL("]");
            }
            ss << ELPP_LITERAL(" for block [") << m_data->blockName()->c_str() << ELPP_LITERAL("] : [") << *m_data->performanceTracker();
            if (!ELPP->hasFlag(LoggingFlag::DisablePerformanceTrackingCheckpointComparison) && m_data->performanceTracker()->m_hasChecked) {
                ss << ELPP_LITERAL(" ([") << *m_data->formattedTimeTaken() << ELPP_LITERAL("] from ");
                if (m_data->performanceTracker()->m_lastCheckpointId.empty()) {
                    ss << ELPP_LITERAL("last checkpoint");
                } else {
                    ss << ELPP_LITERAL("checkpoint '") << m_data->performanceTracker()->m_lastCheckpointId.c_str() << ELPP_LITERAL("'");
                }
                ss << ELPP_LITERAL(")]");
            } else {
                ss << ELPP_LITERAL("]");
            }
        }
        el::base::Writer(m_data->performanceTracker()->level(), m_data->file(), m_data->line(), m_data->func()).construct(1, m_data->loggerId().c_str()) << ss.str();
    }